

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_net_methods.cpp
# Opt level: O0

void Marshall_int16_proc(int the_socket,Am_Value *in_value,Am_Connection *my_connection_ptr)

{
  uint16_t local_28;
  uint16_t local_26;
  int local_24;
  short net_int16;
  short in_int16;
  int in_int;
  Am_Connection *my_connection_ptr_local;
  Am_Value *in_value_local;
  int the_socket_local;
  
  _net_int16 = my_connection_ptr;
  my_connection_ptr_local = (Am_Connection *)in_value;
  in_value_local._4_4_ = the_socket;
  local_24 = Am_Value::operator_cast_to_int(in_value);
  local_26 = (uint16_t)local_24;
  local_28 = htons(local_26);
  send(in_value_local._4_4_,&local_28,2,0);
  return;
}

Assistant:

Am_Define_Method(Am_Marshall_Method, void, Marshall_int16,
                 (int the_socket, const Am_Value &in_value,
                  Am_Connection *my_connection_ptr))
{
  (void)my_connection_ptr; //avoid warning,  used by Lists & Obj
  int in_int = (int)in_value;
  short in_int16 = (short)in_int;
  short net_int16;
  net_int16 = htons(in_int16);
  send(the_socket, &net_int16, sizeof(net_int16), 0);
}